

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitiveSetInvarianceCase::iterate
          (PrimitiveSetInvarianceCase *this)

{
  pointer *this_00;
  TessPrimitiveType primitiveType;
  SpacingMode spacingMode;
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  deUint32 seed;
  int iVar4;
  uint uVar5;
  TestLog *this_01;
  undefined4 extraout_var;
  char *pcVar6;
  Functions *gl_00;
  size_type sVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  RenderContext *renderCtx_00;
  MessageBuilder *pMVar12;
  reference pvVar13;
  ShaderProgram *this_02;
  reference pvVar14;
  const_reference pvVar15;
  TestLog *pTVar16;
  const_reference this_03;
  float *outer_00;
  VertexArrayBinding *local_de0;
  string local_c50;
  string local_c30;
  MessageBuilder local_c10;
  byte local_a89;
  undefined1 local_a88 [7];
  bool compareOk;
  MessageBuilder local_a68;
  MessageBuilder local_8e8;
  MessageBuilder local_768;
  int local_5e4;
  const_reference pvStack_5e0;
  int vtxNdx;
  Vec3 *prim1Vertices;
  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_5d0;
  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_5c8;
  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_5c0;
  undefined1 local_5b8 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> prim0Vertices;
  int half;
  MessageBuilder local_590;
  undefined1 local_410 [8];
  Result tfResult;
  int local_3e8;
  deUint32 programGL;
  int programNdx;
  undefined1 *local_3c0;
  undefined1 local_3b8 [8];
  VertexArrayBinding bindings [1];
  float attribute [14];
  float (*outer) [4];
  float (*inner) [2];
  TessLevels *tessLevels;
  undefined1 local_310 [4];
  int subTessLevelCaseNdx;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  int local_14c;
  undefined1 local_148 [4];
  int i_1;
  string tessLevelsStr;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> firstPrimVertices;
  LevelCase *levelCase;
  undefined1 local_100 [4];
  int tessLevelCaseNdx;
  TFHandler transformFeedback;
  deUint32 primitiveTypeGL;
  int primCount;
  int i;
  vector<int,_std::allocator<int>_> local_98;
  int local_78;
  int local_74;
  int caseNdx;
  int maxNumPrimitives;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  primitiveCounts;
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  tessLevelCases;
  Functions *gl;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  PrimitiveSetInvarianceCase *this_local;
  
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  viewport._8_8_ = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  pcVar6 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar6);
  gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&gl,(RenderTarget *)CONCAT44(extraout_var,iVar3),0x10,0x10,seed);
  gl_00 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (&primitiveCounts.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&caseNdx);
  local_74 = -1;
  for (local_78 = 0; iVar3 = local_78,
      sVar7 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
              ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                      *)&primitiveCounts.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar3 < (int)sVar7;
      local_78 = local_78 + 1) {
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_98);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&caseNdx,&local_98);
    std::vector<int,_std::allocator<int>_>::~vector(&local_98);
    primitiveTypeGL = 0;
    while( true ) {
      pvVar8 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
               ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                             *)&primitiveCounts.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_78);
      sVar7 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
              ::size(&pvVar8->levels);
      if ((int)sVar7 <= (int)primitiveTypeGL) break;
      primitiveType = this->m_primitiveType;
      spacingMode = this->m_spacing;
      bVar2 = this->m_usePointMode;
      this_00 = &primitiveCounts.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar8 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
               ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                             *)this_00,(long)local_78);
      pvVar9 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
               ::operator[](&pvVar8->levels,(long)(int)primitiveTypeGL);
      pvVar8 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
               ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                             *)this_00,(long)local_78);
      pvVar10 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                ::operator[](&pvVar8->levels,(long)(int)primitiveTypeGL);
      transformFeedback.m_tfPrimQuery.super_ObjectWrapper._20_4_ =
           referencePrimitiveCount
                     (primitiveType,spacingMode,(bool)(bVar2 & 1),pvVar9->inner,pvVar10->outer);
      pvVar11 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&caseNdx);
      std::vector<int,_std::allocator<int>_>::push_back
                (pvVar11,(value_type_conflict1 *)
                         &transformFeedback.m_tfPrimQuery.super_ObjectWrapper.field_0x14);
      local_74 = de::max<int>(local_74,transformFeedback.m_tfPrimQuery.super_ObjectWrapper._20_4_);
      primitiveTypeGL = primitiveTypeGL + 1;
    }
  }
  transformFeedback.m_tfPrimQuery.super_ObjectWrapper.m_object =
       outputPrimitiveTypeGL(this->m_primitiveType,(bool)(this->m_usePointMode & 1));
  renderCtx_00 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = local_74;
  iVar4 = numVerticesPerPrimitive(transformFeedback.m_tfPrimQuery.super_ObjectWrapper.m_object);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_100,renderCtx_00,
             iVar3 * iVar4 * 2);
  setViewport(gl_00,(RandomViewport *)&gl);
  (*gl_00->patchParameteri)(0x8e72,7);
  for (levelCase._4_4_ = 0;
      sVar7 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
              ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                      *)&primitiveCounts.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage),
      levelCase._4_4_ < (int)sVar7; levelCase._4_4_ = levelCase._4_4_ + 1) {
    pvVar8 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
             ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                           *)&primitiveCounts.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)levelCase._4_4_);
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               ((long)&tessLevelsStr.field_2 + 8));
    std::__cxx11::string::string((string *)local_148);
    for (local_14c = 0; iVar3 = local_14c,
        sVar7 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                ::size(&pvVar8->levels), iVar3 < (int)sVar7; local_14c = local_14c + 1) {
      sVar7 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
              ::size(&pvVar8->levels);
      pcVar6 = "";
      if (1 < sVar7) {
        pcVar6 = "\n";
      }
      pvVar9 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
               ::operator[](&pvVar8->levels,(long)local_14c);
      (anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels::description_abi_cxx11_
                (&local_190,pvVar9);
      std::operator+(&local_170,pcVar6,&local_190);
      std::__cxx11::string::operator+=((string *)local_148,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
    }
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_310,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_310,(char (*) [26])"Tessellation level sets: ");
    pMVar12 = tcu::MessageBuilder::operator<<
                        (pMVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_148);
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_310);
    std::__cxx11::string::~string((string *)local_148);
    for (tessLevels._4_4_ = 0;
        sVar7 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                ::size(&pvVar8->levels), tessLevels._4_4_ < (int)sVar7;
        tessLevels._4_4_ = tessLevels._4_4_ + 1) {
      pvVar9 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
               ::operator[](&pvVar8->levels,(long)tessLevels._4_4_);
      bindings[0].pointer.data._0_4_ = pvVar9->inner[0];
      bindings[0].pointer.data._4_4_ = pvVar9->inner[1];
      programGL._2_1_ = 1;
      local_3c0 = local_3b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&programNdx,"in_v_attr",(allocator<char> *)((long)&programGL + 3));
      glu::va::Float((VertexArrayBinding *)local_3b8,(string *)&programNdx,1,0xe,0,
                     (float *)&bindings[0].pointer.data);
      programGL._2_1_ = 0;
      std::__cxx11::string::~string((string *)&programNdx);
      std::allocator<char>::~allocator((allocator<char> *)((long)&programGL + 3));
      for (local_3e8 = 0; iVar3 = local_3e8,
          sVar7 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                  ::size(&this->m_programs), iVar3 < (int)sVar7; local_3e8 = local_3e8 + 1) {
        pvVar13 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                  ::operator[](&this->m_programs,(long)local_3e8);
        this_02 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&pvVar13->program);
        tfResult.varying.
        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = glu::ShaderProgram::getProgram(this_02);
        (*gl_00->useProgram)
                  (tfResult.varying.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                  ((Result *)local_410,(TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_100
                   ,tfResult.varying.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                   transformFeedback.m_tfPrimQuery.super_ObjectWrapper.m_object,1,
                   (VertexArrayBinding *)local_3b8,0xe);
        uVar1 = local_410._0_4_;
        pvVar11 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)&caseNdx,(long)levelCase._4_4_);
        pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](pvVar11,(long)tessLevels._4_4_)
        ;
        if (uVar1 == *pvVar14 * 2) {
          sVar7 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)&tfResult);
          prim0Vertices.
          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._4_4_ =
               (int)((int)sVar7 + ((uint)(sVar7 >> 0x1f) & 1)) >> 1;
          local_5c0._M_current =
               (Vector<float,_3> *)
               std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::begin
                         ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          &tfResult);
          local_5d0._M_current =
               (Vector<float,_3> *)
               std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::begin
                         ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          &tfResult);
          local_5c8 = __gnu_cxx::
                      __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                      ::operator+(&local_5d0,
                                  (long)prim0Vertices.
                                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          std::allocator<tcu::Vector<float,_3>_>::allocator
                    ((allocator<tcu::Vector<float,_3>_> *)((long)&prim1Vertices + 7));
          std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
          vector<__gnu_cxx::__normal_iterator<tcu::Vector<float,3>const*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>,void>
                    ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)local_5b8,
                     local_5c0,local_5c8,
                     (allocator<tcu::Vector<float,_3>_> *)((long)&prim1Vertices + 7));
          std::allocator<tcu::Vector<float,_3>_>::~allocator
                    ((allocator<tcu::Vector<float,_3>_> *)((long)&prim1Vertices + 7));
          pvStack_5e0 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ::operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                      *)&tfResult,
                                     (long)prim0Vertices.
                                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
          ;
          for (local_5e4 = 0; iVar3 = local_5e4,
              sVar7 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                      size((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
                           )local_5b8), iVar3 < (int)sVar7; local_5e4 = local_5e4 + 1) {
            pvVar15 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                      operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  *)local_5b8,(long)local_5e4);
            bVar2 = tcu::Vector<float,_3>::operator!=(pvVar15,pvStack_5e0 + local_5e4);
            if (bVar2) {
              tcu::TestLog::operator<<
                        (&local_a68,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar12 = tcu::MessageBuilder::operator<<
                                  (&local_a68,
                                   (char (*) [43])"Failure: tessellation coordinate at index ");
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_5e4);
              pMVar12 = tcu::MessageBuilder::operator<<
                                  (pMVar12,(char (*) [55])
                                           " differs between two primitives drawn in one draw call")
              ;
              pTVar16 = tcu::MessageBuilder::operator<<
                                  (pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::TestLog::operator<<
                        (&local_8e8,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar12 = tcu::MessageBuilder::operator<<
                                  (&local_8e8,(char (*) [25])"Note: the coordinate is ");
              pvVar15 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ::operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                      *)local_5b8,(long)local_5e4);
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,pvVar15);
              pMVar12 = tcu::MessageBuilder::operator<<
                                  (pMVar12,(char (*) [30])" for the first primitive and ");
              outer_00 = (float *)((long)local_5e4 * 3);
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,pvStack_5e0 + local_5e4);
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [16])" for the second");
              pTVar16 = tcu::MessageBuilder::operator<<
                                  (pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::TestLog::operator<<
                        (&local_768,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar12 = tcu::MessageBuilder::operator<<
                                  (&local_768,
                                   (char (*) [53])
                                   "Note: tessellation levels for both primitives were: ");
              (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                        ((string *)local_a88,(_anonymous_namespace_ *)pvVar9,pvVar9->outer,outer_00)
              ;
              pMVar12 = tcu::MessageBuilder::operator<<
                                  (pMVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_a88);
              tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::string::~string((string *)local_a88);
              tcu::MessageBuilder::~MessageBuilder(&local_768);
              tcu::MessageBuilder::~MessageBuilder(&local_8e8);
              tcu::MessageBuilder::~MessageBuilder(&local_a68);
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_FAIL,"Invalid set of primitives");
              this_local._4_4_ = STOP;
              bVar2 = true;
              goto LAB_006aaa79;
            }
          }
          if ((local_3e8 == 0) && (tessLevels._4_4_ == 0)) {
            std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator=
                      ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       ((long)&tessLevelsStr.field_2 + 8),
                       (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       local_5b8);
LAB_006aaa6f:
            bVar2 = false;
          }
          else {
            uVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                              (this,(undefined1 *)((long)&tessLevelsStr.field_2 + 8),local_5b8,
                               (ulong)(uint)pvVar8->mem);
            local_a89 = (byte)uVar5 & 1;
            if ((uVar5 & 1) != 0) goto LAB_006aaa6f;
            tcu::TestLog::operator<<(&local_c10,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar12 = tcu::MessageBuilder::operator<<
                                (&local_c10,
                                 (char (*) [99])
                                 "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
                                );
            pMVar12 = tcu::MessageBuilder::operator<<
                                (pMVar12,(char (*) [45])
                                         "  - case A: program 0, tessellation levels: ");
            this_03 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                      ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                                    *)&primitiveCounts.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)levelCase._4_4_);
            pvVar10 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                      ::operator[](&this_03->levels,0);
            (anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels::description_abi_cxx11_
                      (&local_c30,pvVar10);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_c30);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0xf12600);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [21])"  - case B: program ")
            ;
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_3e8);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [24])0xf1edbc);
            (anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels::description_abi_cxx11_
                      (&local_c50,pvVar9);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_c50);
            tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_c50);
            std::__cxx11::string::~string((string *)&local_c30);
            tcu::MessageBuilder::~MessageBuilder(&local_c10);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of primitives");
            this_local._4_4_ = STOP;
            bVar2 = true;
          }
LAB_006aaa79:
          std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     local_5b8);
          if (!bVar2) {
            bVar2 = false;
          }
        }
        else {
          tcu::TestLog::operator<<(&local_590,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar12 = tcu::MessageBuilder::operator<<
                              (&local_590,
                               (char (*) [69])
                               "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be "
                              );
          pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(int *)local_410);
          pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [22])", reference value is ");
          pvVar11 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)&caseNdx,(long)levelCase._4_4_);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (pvVar11,(long)tessLevels._4_4_);
          half = *pvVar14 * 2;
          pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&half);
          tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_590);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of primitives");
          this_local._4_4_ = STOP;
          bVar2 = true;
        }
        TransformFeedbackHandler<tcu::Vector<float,_3>_>::Result::~Result((Result *)local_410);
        if (bVar2) goto LAB_006aaaed;
      }
      bVar2 = false;
LAB_006aaaed:
      local_de0 = (VertexArrayBinding *)&bindings[0].pointer.data;
      do {
        local_de0 = local_de0 + -1;
        glu::VertexArrayBinding::~VertexArrayBinding(local_de0);
      } while (local_de0 != (VertexArrayBinding *)local_3b8);
      if (bVar2) goto LAB_006aabaf;
    }
    bVar2 = false;
LAB_006aabaf:
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               ((long)&tessLevelsStr.field_2 + 8));
    if (bVar2) goto LAB_006aac17;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  this_local._4_4_ = STOP;
LAB_006aac17:
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_100);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&caseNdx);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
             *)&primitiveCounts.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._4_4_;
}

Assistant:

PrimitiveSetInvarianceCase::IterateResult PrimitiveSetInvarianceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&					log					= m_testCtx.getLog();
	const RenderContext&		renderCtx			= m_context.getRenderContext();
	const RandomViewport		viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&		gl					= renderCtx.getFunctions();
	const vector<LevelCase>		tessLevelCases		= genTessLevelCases();
	vector<vector<int> >		primitiveCounts;
	int							maxNumPrimitives	= -1;

	for (int caseNdx = 0; caseNdx < (int)tessLevelCases.size(); caseNdx++)
	{
		primitiveCounts.push_back(vector<int>());
		for (int i = 0; i < (int)tessLevelCases[caseNdx].levels.size(); i++)
		{
			const int primCount = referencePrimitiveCount(m_primitiveType, m_spacing, m_usePointMode,
														  &tessLevelCases[caseNdx].levels[i].inner[0], &tessLevelCases[caseNdx].levels[i].outer[0]);
			primitiveCounts.back().push_back(primCount);
			maxNumPrimitives = de::max(maxNumPrimitives, primCount);
		}
	}

	const deUint32				primitiveTypeGL		= outputPrimitiveTypeGL(m_primitiveType, m_usePointMode);
	const TFHandler				transformFeedback	(m_context.getRenderContext(), 2*maxNumPrimitives*numVerticesPerPrimitive(primitiveTypeGL));

	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 7);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const LevelCase&	levelCase = tessLevelCases[tessLevelCaseNdx];
		vector<Vec3>		firstPrimVertices;

		{
			string tessLevelsStr;
			for (int i = 0; i < (int)levelCase.levels.size(); i++)
				tessLevelsStr += (levelCase.levels.size() > 1 ? "\n" : "") + levelCase.levels[i].description();
			log << TestLog::Message << "Tessellation level sets: " << tessLevelsStr << TestLog::EndMessage;
		}

		for (int subTessLevelCaseNdx = 0; subTessLevelCaseNdx < (int)levelCase.levels.size(); subTessLevelCaseNdx++)
		{
			const TessLevels&				tessLevels		= levelCase.levels[subTessLevelCaseNdx];
			const float						(&inner)[2]		= tessLevels.inner;
			const float						(&outer)[4]		= tessLevels.outer;
			const float						attribute[2*7]	= { inner[0], inner[1], outer[0], outer[1], outer[2], outer[3], 0.0f,
																inner[0], inner[1], outer[0], outer[1], outer[2], outer[3], 0.5f };
			const glu::VertexArrayBinding	bindings[]		= { glu::va::Float("in_v_attr", 1, DE_LENGTH_OF_ARRAY(attribute), 0, &attribute[0]) };

			for (int programNdx = 0; programNdx < (int)m_programs.size(); programNdx++)
			{
				const deUint32				programGL	= m_programs[programNdx].program->getProgram();
				gl.useProgram(programGL);
				const TFHandler::Result		tfResult	= transformFeedback.renderAndGetPrimitives(programGL, primitiveTypeGL, DE_LENGTH_OF_ARRAY(bindings), &bindings[0], DE_LENGTH_OF_ARRAY(attribute));

				if (tfResult.numPrimitives != 2*primitiveCounts[tessLevelCaseNdx][subTessLevelCaseNdx])
				{
					log << TestLog::Message << "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be "
											<< tfResult.numPrimitives << ", reference value is " << 2*primitiveCounts[tessLevelCaseNdx][subTessLevelCaseNdx]
											<< TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of primitives");
					return STOP;
				}

				{
					const int			half			= (int)tfResult.varying.size()/2;
					const vector<Vec3>	prim0Vertices	= vector<Vec3>(tfResult.varying.begin(), tfResult.varying.begin() + half);
					const Vec3* const	prim1Vertices	= &tfResult.varying[half];

					for (int vtxNdx = 0; vtxNdx < (int)prim0Vertices.size(); vtxNdx++)
					{
						if (prim0Vertices[vtxNdx] != prim1Vertices[vtxNdx])
						{
							log << TestLog::Message << "Failure: tessellation coordinate at index " << vtxNdx << " differs between two primitives drawn in one draw call" << TestLog::EndMessage
								<< TestLog::Message << "Note: the coordinate is " << prim0Vertices[vtxNdx] << " for the first primitive and " << prim1Vertices[vtxNdx] << " for the second" << TestLog::EndMessage
								<< TestLog::Message << "Note: tessellation levels for both primitives were: " << tessellationLevelsString(&inner[0], &outer[0]) << TestLog::EndMessage;
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of primitives");
							return STOP;
						}
					}

					if (programNdx == 0 && subTessLevelCaseNdx == 0)
						firstPrimVertices = prim0Vertices;
					else
					{
						const bool compareOk = compare(firstPrimVertices, prim0Vertices, levelCase.mem);
						if (!compareOk)
						{
							log << TestLog::Message << "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
													<< "  - case A: program 0, tessellation levels: " << tessLevelCases[tessLevelCaseNdx].levels[0].description() << "\n"
													<< "  - case B: program " << programNdx << ", tessellation levels: " << tessLevels.description() << TestLog::EndMessage;
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of primitives");
							return STOP;
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}